

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O3

bool __thiscall
cmExportInstallFileGenerator::GenerateMainFile(cmExportInstallFileGenerator *this,ostream *os)

{
  cmTargetExport *pcVar1;
  cmExportSet *pcVar2;
  pointer puVar3;
  cmGeneratorTarget *this_00;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  TargetType TVar7;
  PolicyStatus PVar8;
  int iVar9;
  long *plVar10;
  ostream *poVar11;
  string *psVar12;
  cmValue cVar13;
  char *pcVar14;
  char *pcVar15;
  uint uVar16;
  pointer puVar17;
  undefined8 uVar18;
  ostream *os_00;
  string *c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  pointer pbVar20;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar21;
  string expectedTargets;
  string sep;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> allTargets;
  ostringstream e;
  string local_288;
  uint local_264;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  ostream *local_240;
  undefined8 local_238;
  ulong local_230;
  ulong local_228;
  cmTargetExport *local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  long *local_1f8;
  long *plStack_1f0;
  long local_1e8;
  string local_1d8;
  long *local_1b8;
  long *local_1b0;
  undefined1 local_1a8 [16];
  undefined1 local_198 [360];
  
  local_1f8 = (long *)0x0;
  plStack_1f0 = (long *)0x0;
  local_1e8 = 0;
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  local_288._M_string_length = 0;
  local_288.field_2._M_local_buf[0] = '\0';
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_260._M_string_length = 0;
  local_260.field_2._M_local_buf[0] = '\0';
  pcVar2 = this->IEGen->ExportSet;
  puVar17 = (pcVar2->TargetExports).
            super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pcVar2->TargetExports).
           super__Vector_base<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_240 = os;
  if (puVar17 != puVar3) {
    paVar19 = &local_218.field_2;
    do {
      if (((puVar17->_M_t).
           super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
           super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->NamelinkOnly == false) {
        std::operator+(&local_218,&local_260,&(this->super_cmExportFileGenerator).Namespace);
        cmGeneratorTarget::GetExportName_abi_cxx11_
                  (&local_1d8,
                   ((puVar17->_M_t).
                    super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t
                    .super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
                    super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target);
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar19) {
          uVar18 = local_218.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_1d8._M_string_length + local_218._M_string_length) {
          uVar18 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
            uVar18 = local_1d8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar18 < local_1d8._M_string_length + local_218._M_string_length)
          goto LAB_0055db83;
          plVar10 = (long *)std::__cxx11::string::replace
                                      ((ulong)&local_1d8,0,(char *)0x0,
                                       (ulong)local_218._M_dataplus._M_p);
        }
        else {
LAB_0055db83:
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_218,(ulong)local_1d8._M_dataplus._M_p);
        }
        pcVar1 = (cmTargetExport *)(plVar10 + 2);
        if ((cmTargetExport *)*plVar10 == pcVar1) {
          local_198._0_8_ = (pcVar1->TargetName)._M_dataplus._M_p;
          local_198._8_8_ = plVar10[3];
          local_1a8._0_8_ = (cmTargetExport *)local_198;
        }
        else {
          local_198._0_8_ = (pcVar1->TargetName)._M_dataplus._M_p;
          local_1a8._0_8_ = (cmTargetExport *)*plVar10;
        }
        local_1a8._8_8_ = plVar10[1];
        *plVar10 = (long)pcVar1;
        plVar10[1] = 0;
        *(undefined1 *)&(pcVar1->TargetName)._M_dataplus._M_p = 0;
        std::__cxx11::string::_M_append((char *)&local_288,local_1a8._0_8_);
        if ((cmTargetExport *)local_1a8._0_8_ != (cmTargetExport *)local_198) {
          operator_delete((void *)local_1a8._0_8_,(ulong)(local_198._0_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != paVar19) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_replace
                  ((ulong)&local_260,0,(char *)local_260._M_string_length,0x77d8be);
        pVar21 = std::
                 _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                 ::_M_insert_unique<cmGeneratorTarget*const&>
                           ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                             *)&(this->super_cmExportFileGenerator).ExportedTargets,
                            &((puVar17->_M_t).
                              super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                              .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->Target)
        ;
        if (((undefined1  [16])pVar21 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"install(EXPORT \"",0x10);
          os_00 = local_240;
          pcVar2 = this->IEGen->ExportSet;
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_1a8,(pcVar2->Name)._M_dataplus._M_p,
                               (pcVar2->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\" ...) ",7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,"includes target \"",0x11);
          psVar12 = cmGeneratorTarget::GetName_abi_cxx11_
                              (((puVar17->_M_t).
                                super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>
                                .super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl)->
                               Target);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,(psVar12->_M_dataplus)._M_p,psVar12->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,"\" more than once in the export set.",0x23);
          std::__cxx11::stringbuf::str();
          cmSystemTools::Error(&local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._M_dataplus._M_p != paVar19) {
            operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base((ios_base *)(local_198 + 0x60));
          bVar5 = false;
          goto LAB_0055de0d;
        }
        local_1a8._0_8_ =
             (puVar17->_M_t).
             super___uniq_ptr_impl<cmTargetExport,_std::default_delete<cmTargetExport>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetExport_*,_std::default_delete<cmTargetExport>_>.
             super__Head_base<0UL,_cmTargetExport_*,_false>._M_head_impl;
        std::vector<cmTargetExport*,std::allocator<cmTargetExport*>>::emplace_back<cmTargetExport*>
                  ((vector<cmTargetExport*,std::allocator<cmTargetExport*>> *)&local_1f8,
                   (cmTargetExport **)local_1a8);
      }
      puVar17 = puVar17 + 1;
    } while (puVar17 != puVar3);
  }
  os_00 = local_240;
  bVar5 = true;
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])(this,local_240,&local_288)
  ;
LAB_0055de0d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,
                    CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                             local_288.field_2._M_local_buf[0]) + 1);
  }
  if (bVar5) {
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x17])(this,os_00);
    local_1b8 = plStack_1f0;
    if (local_1f8 == plStack_1f0) {
      uVar16 = 0;
    }
    else {
      local_238 = 0;
      local_230 = 0;
      local_228 = 0;
      local_264 = 0;
      plVar10 = local_1f8;
      do {
        paVar19 = &local_288.field_2;
        local_220 = (cmTargetExport *)*plVar10;
        this_00 = local_220->Target;
        local_1b0 = plVar10;
        TVar7 = cmGeneratorTarget::GetType(this_00);
        if (TVar7 == OBJECT_LIBRARY) {
          TVar7 = (uint)(local_220->ObjectsGenerator == (cmInstallTargetGenerator *)0x0) * 3 +
                  OBJECT_LIBRARY;
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])(this,os_00,this_00);
        local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
        local_198._0_8_ = (pointer)0x0;
        local_198._8_8_ = local_1a8 + 8;
        local_198._24_8_ = 0;
        local_198._16_8_ = local_198._8_8_;
        cmExportFileGenerator::PopulateIncludeDirectoriesInterface
                  (&this->super_cmExportFileGenerator,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8,local_220);
        cmExportFileGenerator::PopulateSourcesInterface
                  (&this->super_cmExportFileGenerator,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        local_288._M_dataplus._M_p = (pointer)paVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_288,"INTERFACE_SYSTEM_INCLUDE_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_288,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != paVar19) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        local_288._M_dataplus._M_p = (pointer)paVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_288,"INTERFACE_COMPILE_DEFINITIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_288,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != paVar19) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        local_288._M_dataplus._M_p = (pointer)paVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_288,"INTERFACE_COMPILE_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_288,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != paVar19) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        local_288._M_dataplus._M_p = (pointer)paVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_288,"INTERFACE_PRECOMPILE_HEADERS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_288,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != paVar19) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        local_288._M_dataplus._M_p = (pointer)paVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_288,"INTERFACE_AUTOUIC_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_288,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != paVar19) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        local_288._M_dataplus._M_p = (pointer)paVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_288,"INTERFACE_COMPILE_FEATURES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_288,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != paVar19) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        local_288._M_dataplus._M_p = (pointer)paVar19;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_288,"INTERFACE_LINK_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_288,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != paVar19) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        cmExportFileGenerator::PopulateLinkDirectoriesInterface
                  (&this->super_cmExportFileGenerator,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        cmExportFileGenerator::PopulateLinkDependsInterface
                  (&this->super_cmExportFileGenerator,this_00,InstallInterface,
                   (ImportPropertyMap *)local_1a8);
        local_288._M_string_length = 0;
        local_288.field_2._M_local_buf[0] = '\0';
        local_288._M_dataplus._M_p = (pointer)paVar19;
        bVar5 = cmExportFileGenerator::PopulateExportProperties
                          (&this->super_cmExportFileGenerator,this_00,(ImportPropertyMap *)local_1a8
                           ,&local_288);
        if (bVar5) {
          PVar8 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022);
          if (((PVar8 != WARN) &&
              (PVar8 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022), PVar8 != OLD)) &&
             (bVar6 = cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                                (&this->super_cmExportFileGenerator,this_00,InstallInterface,
                                 (ImportPropertyMap *)local_1a8), bVar6)) {
            local_238 = CONCAT71((int7)((ulong)local_238 >> 8),
                                 (byte)local_238 |
                                 (this->super_cmExportFileGenerator).ExportOld ^ 1U);
          }
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_260,"INTERFACE_SOURCES","");
          cVar13 = cmGeneratorTarget::GetProperty(this_00,&local_260);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,
                            CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                     local_260.field_2._M_local_buf[0]) + 1);
          }
          local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_260,"INTERFACE_POSITION_INDEPENDENT_CODE","");
          cmExportFileGenerator::PopulateInterfaceProperty
                    (&this->super_cmExportFileGenerator,&local_260,this_00,
                     (ImportPropertyMap *)local_1a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_260._M_dataplus._M_p != &local_260.field_2) {
            operator_delete(local_260._M_dataplus._M_p,
                            CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                     local_260.field_2._M_local_buf[0]) + 1);
          }
          cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                    (&this->super_cmExportFileGenerator,this_00,(ImportPropertyMap *)local_1a8);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                    (this,this_00,local_240,local_1a8);
          cmExportFileGenerator::GenerateTargetFileSets
                    (&this->super_cmExportFileGenerator,this_00,local_240,local_220);
          local_230 = CONCAT71((int7)(local_230 >> 8),(byte)local_230 | TVar7 == INTERFACE_LIBRARY);
          local_228 = CONCAT71((int7)(local_228 >> 8),
                               (byte)local_228 | cVar13.Value != (string *)0x0);
        }
        else {
          cmSystemTools::Error(&local_288);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1a8);
        os_00 = local_240;
        if (!bVar5) goto LAB_0055e3e9;
        uVar16 = CONCAT31((int3)(local_264 >> 8),(byte)local_264 | TVar7 != INTERFACE_LIBRARY);
        plVar10 = local_1b0 + 1;
        local_264 = uVar16;
      } while (plVar10 != local_1b8);
      if ((((byte)local_228 | (byte)local_230 | (byte)local_238) & 1) != 0) {
        pcVar14 = "2.8.12";
        if ((local_230 & 1) != 0) {
          pcVar14 = "3.0.0";
        }
        pcVar15 = "3.1.0";
        if ((local_228 & 1) == 0) {
          pcVar15 = pcVar14;
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                  (this,local_240,pcVar15);
        uVar16 = local_264;
      }
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x18])(this,os_00);
    cmExportFileGenerator::GenerateCxxModuleInformation(&this->super_cmExportFileGenerator,os_00);
    bVar5 = true;
    if ((uVar16 & 1) != 0) {
      pbVar20 = (this->super_cmExportFileGenerator).Configurations.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar4 = (this->super_cmExportFileGenerator).Configurations.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar20 != pbVar4) {
        bVar5 = true;
        do {
          bVar6 = GenerateImportCxxModuleConfigTargetInclusion(this,pbVar20);
          bVar5 = (bool)(bVar5 & bVar6);
          pbVar20 = pbVar20 + 1;
        } while (pbVar20 != pbVar4);
      }
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x19])(this,os_00);
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[9])(this,os_00);
    if ((uVar16 & 1) != 0) {
      pbVar4 = (this->super_cmExportFileGenerator).Configurations.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar20 = (this->super_cmExportFileGenerator).Configurations.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; pbVar20 != pbVar4;
          pbVar20 = pbVar20 + 1) {
        iVar9 = (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x1a])
                          (this,pbVar20);
        bVar5 = (bool)(bVar5 & (byte)iVar9);
      }
    }
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])(this,os_00);
  }
  else {
LAB_0055e3e9:
    bVar5 = false;
  }
  if (local_1f8 != (long *)0x0) {
    operator_delete(local_1f8,local_1e8 - (long)local_1f8);
  }
  return bVar5;
}

Assistant:

bool cmExportInstallFileGenerator::GenerateMainFile(std::ostream& os)
{
  std::vector<cmTargetExport*> allTargets;
  {
    std::string expectedTargets;
    std::string sep;
    for (std::unique_ptr<cmTargetExport> const& te :
         this->IEGen->GetExportSet()->GetTargetExports()) {
      if (te->NamelinkOnly) {
        continue;
      }
      expectedTargets += sep + this->Namespace + te->Target->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te->Target).second) {
        allTargets.push_back(te.get());
      } else {
        std::ostringstream e;
        e << "install(EXPORT \"" << this->IEGen->GetExportSet()->GetName()
          << "\" ...) "
          << "includes target \"" << te->Target->GetName()
          << "\" more than once in the export set.";
        cmSystemTools::Error(e.str());
        return false;
      }
    }

    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  // Compute the relative import prefix for the file
  this->GenerateImportPrefix(os);

  bool require2_8_12 = false;
  bool require3_0_0 = false;
  bool require3_1_0 = false;
  bool requiresConfigFiles = false;
  // Create all the imported targets.
  for (cmTargetExport* te : allTargets) {
    cmGeneratorTarget* gt = te->Target;
    cmStateEnums::TargetType targetType = this->GetExportTargetType(te);

    requiresConfigFiles =
      requiresConfigFiles || targetType != cmStateEnums::INTERFACE_LIBRARY;

    this->GenerateImportTargetCode(os, gt, targetType);

    ImportPropertyMap properties;

    this->PopulateIncludeDirectoriesInterface(
      gt, cmGeneratorExpression::InstallInterface, properties, *te);
    this->PopulateSourcesInterface(gt, cmGeneratorExpression::InstallInterface,
                                   properties);
    this->PopulateInterfaceProperty("INTERFACE_SYSTEM_INCLUDE_DIRECTORIES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_PRECOMPILE_HEADERS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gt,
                                    cmGeneratorExpression::InstallInterface,
                                    properties);
    this->PopulateLinkDirectoriesInterface(
      gt, cmGeneratorExpression::InstallInterface, properties);
    this->PopulateLinkDependsInterface(
      gt, cmGeneratorExpression::InstallInterface, properties);

    std::string errorMessage;
    if (!this->PopulateExportProperties(gt, properties, errorMessage)) {
      cmSystemTools::Error(errorMessage);
      return false;
    }

    const bool newCMP0022Behavior =
      gt->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gt->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      if (this->PopulateInterfaceLinkLibrariesProperty(
            gt, cmGeneratorExpression::InstallInterface, properties) &&
          !this->ExportOld) {
        require2_8_12 = true;
      }
    }
    if (targetType == cmStateEnums::INTERFACE_LIBRARY) {
      require3_0_0 = true;
    }
    if (gt->GetProperty("INTERFACE_SOURCES")) {
      // We can only generate INTERFACE_SOURCES in CMake 3.3, but CMake 3.1
      // can consume them.
      require3_1_0 = true;
    }

    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gt,
                                    properties);

    this->PopulateCompatibleInterfaceProperties(gt, properties);

    this->GenerateInterfaceProperties(gt, os, properties);

    this->GenerateTargetFileSets(gt, os, te);
  }

  if (require3_1_0) {
    this->GenerateRequiredCMakeVersion(os, "3.1.0");
  } else if (require3_0_0) {
    this->GenerateRequiredCMakeVersion(os, "3.0.0");
  } else if (require2_8_12) {
    this->GenerateRequiredCMakeVersion(os, "2.8.12");
  }

  this->LoadConfigFiles(os);

  bool result = true;

  this->GenerateCxxModuleInformation(os);
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportCxxModuleConfigTargetInclusion(c)) {
        result = false;
      }
    }
  }

  this->CleanupTemporaryVariables(os);
  this->GenerateImportedFileCheckLoop(os);

  // Generate an import file for each configuration.
  // Don't do this if we only export INTERFACE_LIBRARY targets.
  if (requiresConfigFiles) {
    for (std::string const& c : this->Configurations) {
      if (!this->GenerateImportFileConfig(c)) {
        result = false;
      }
    }
  }

  this->GenerateMissingTargetsCheckCode(os);

  return result;
}